

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O1

Vector<3> *
Omega_h::inertia::anon_unknown_0::get_center
          (Vector<3> *__return_storage_ptr__,CommPtr *comm,Reals *coords,Reals *masses,
          Real total_mass)

{
  int *piVar1;
  double dVar2;
  Alloc *pAVar3;
  int iVar4;
  Int i_1;
  long lVar5;
  long lVar6;
  Int i;
  long lVar7;
  IntIterator last;
  size_t sVar8;
  Write<double> weighted_coords;
  Vector<3> result;
  type f;
  Vector<3> c;
  Write<double> local_148;
  undefined1 local_138 [32];
  Alloc *local_118;
  void *local_110;
  Alloc *local_108;
  void *pvStack_100;
  Alloc *local_f8;
  void *pvStack_f0;
  Alloc *local_e8;
  void *pvStack_e0;
  Alloc *local_d0;
  void *local_c8;
  Alloc *local_c0;
  void *local_b8;
  Alloc *local_b0;
  void *local_a8;
  Write<double> local_a0;
  CommPtr local_90;
  Real local_80;
  Read<signed_char> local_78;
  double local_68 [4];
  double local_48 [3];
  
  pAVar3 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar8 = pAVar3->size;
  }
  else {
    sVar8 = (ulong)pAVar3 >> 3;
  }
  local_138._0_8_ = (Alloc *)(local_138 + 0x10);
  local_80 = total_mass;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
  iVar4 = (int)(sVar8 >> 3);
  Write<double>::Write(&local_148,iVar4 * 3,(string *)local_138);
  if ((Alloc *)local_138._0_8_ != (Alloc *)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
  }
  local_d0 = local_148.shared_alloc_.alloc;
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0 = (Alloc *)((local_148.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_148.shared_alloc_.alloc)->use_count = (local_148.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c8 = local_148.shared_alloc_.direct_ptr;
  local_c0 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0 = (Alloc *)(local_c0->size * 8 + 1);
    }
    else {
      local_c0->use_count = local_c0->use_count + 1;
    }
  }
  local_b8 = (masses->write_).shared_alloc_.direct_ptr;
  local_b0 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  local_a8 = (coords->write_).shared_alloc_.direct_ptr;
  local_108 = local_d0;
  if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(local_d0->size * 8 + 1);
    }
    else {
      local_d0->use_count = local_d0->use_count + 1;
    }
  }
  pvStack_100 = local_148.shared_alloc_.direct_ptr;
  local_f8 = local_c0;
  if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (Alloc *)(local_c0->size * 8 + 1);
    }
    else {
      local_c0->use_count = local_c0->use_count + 1;
    }
  }
  local_e8 = local_b0;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  pvStack_f0 = local_b8;
  pvStack_e0 = local_a8;
  if (0 < iVar4) {
    local_138._0_8_ = local_108;
    local_138._8_8_ = local_148.shared_alloc_.direct_ptr;
    if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
      local_108->use_count = local_108->use_count + -1;
      local_138._0_8_ = (Alloc *)(local_108->size * 8 + 1);
    }
    local_108 = (Alloc *)0x0;
    pvStack_100 = (void *)0x0;
    local_138._16_8_ = local_f8;
    if (((ulong)local_f8 & 7) == 0 && local_f8 != (Alloc *)0x0) {
      local_f8->use_count = local_f8->use_count + -1;
      local_138._16_8_ = (Alloc *)(local_f8->size * 8 + 1);
    }
    local_f8 = (Alloc *)0x0;
    pvStack_f0 = (void *)0x0;
    local_118 = local_e8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_e8->use_count = local_e8->use_count + -1;
      local_118 = (Alloc *)(local_e8->size * 8 + 1);
    }
    local_e8 = (Alloc *)0x0;
    pvStack_e0 = (void *)0x0;
    entering_parallel = '\0';
    lVar5 = 0;
    do {
      dVar2 = *(double *)((long)local_b8 + lVar5 * 8);
      lVar6 = (lVar5 << 0x20) * 3 >> 0x1d;
      local_68[2] = (double)*(undefined8 *)((long)local_a8 + lVar6 + 0x10);
      local_68[0] = *(double *)((long)local_a8 + lVar6);
      local_68[1] = ((double *)((long)local_a8 + lVar6))[1];
      lVar7 = 0;
      do {
        local_48[lVar7] = local_68[lVar7] * dVar2;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      *(double *)((long)local_148.shared_alloc_.direct_ptr + lVar6 + 0x10) = local_48[2];
      *(double *)((long)local_148.shared_alloc_.direct_ptr + lVar6) = local_48[0];
      ((double *)((long)local_148.shared_alloc_.direct_ptr + lVar6))[1] = local_48[1];
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 != iVar4);
    local_138._24_8_ = local_b8;
    local_110 = local_a8;
    (anonymous_namespace)::
    get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::
    $_0::~__0((__0 *)local_138);
  }
  (anonymous_namespace)::
  get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0
  ::~__0((__0 *)&local_108);
  local_90.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_90.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_90.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_90.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_90.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_a0.shared_alloc_.alloc = local_148.shared_alloc_.alloc;
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.shared_alloc_.alloc = (Alloc *)((local_148.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_148.shared_alloc_.alloc)->use_count = (local_148.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a0.shared_alloc_.direct_ptr = local_148.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_78,&local_a0);
  repro_sum(&local_90,(Reals *)&local_78,3,(Real *)&local_108);
  if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
      operator_delete(local_78.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_a0.shared_alloc_.alloc;
  if (((ulong)local_a0.shared_alloc_.alloc & 7) == 0 && local_a0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_a0.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (local_90.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_138._16_8_ = local_f8;
  local_138._0_8_ = local_108;
  local_138._8_8_ = pvStack_100;
  lVar5 = 0;
  do {
    (__return_storage_ptr__->super_Few<double,_3>).array_[lVar5] =
         *(double *)(local_138 + lVar5 * 8) / local_80;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  (anonymous_namespace)::
  get_center(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0
  ::~__0((__0 *)&local_d0);
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_148.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148.shared_alloc_.alloc);
      operator_delete(local_148.shared_alloc_.alloc,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<3> get_center(
    CommPtr comm, Reals coords, Reals masses, Real total_mass) {
  auto n = masses.size();
  Write<Real> weighted_coords(n * 3);
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_vector<3>(weighted_coords, i, masses[i] * get_vector<3>(coords, i));
  };
  parallel_for(n, f, "get_center");
  Vector<3> result;
  repro_sum(comm, Reals(weighted_coords), 3, &result[0]);
  return result / total_mass;
}